

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O3

void __thiscall
Lib::DArray<std::pair<unsigned_int,unsigned_int>>::
sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>
          (DArray<std::pair<unsigned_int,unsigned_int>> *this)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  result_type_conflict1 rVar4;
  int iVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  uint uVar8;
  long lVar9;
  undefined4 uVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long s;
  unsigned_long uVar13;
  unsigned_long *res;
  param_type local_38;
  
  if (1 < *(ulong *)this) {
    if ((sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(Indexing::CodeTree::ILStruct::GVArrComparator)
         ::ft == '\0') &&
       (iVar5 = __cxa_guard_acquire(&sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(Indexing::CodeTree::ILStruct::GVArrComparator)
                                     ::ft), iVar5 != 0)) {
      DArray<std::pair<unsigned_int,_unsigned_int>_>::
      sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._size = 0x20;
      DArray<std::pair<unsigned_int,_unsigned_int>_>::
      sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._capacity = 0x20;
      puVar7 = (unsigned_long *)::operator_new(0x100,0x10);
      if (DArray<std::pair<unsigned_int,_unsigned_int>_>::
          sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._capacity != 0) {
        memset(puVar7,0,DArray<std::pair<unsigned_int,_unsigned_int>_>::
                        sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._capacity
                        << 3);
      }
      DArray<std::pair<unsigned_int,_unsigned_int>_>::
      sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._array = puVar7;
      __cxa_atexit(DArray<unsigned_long>::~DArray,
                   &DArray<std::pair<unsigned_int,_unsigned_int>_>::
                    sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,&__dso_handle)
      ;
      __cxa_guard_release(&sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(Indexing::CodeTree::ILStruct::GVArrComparator)
                           ::ft);
    }
    s = *(long *)this - 1;
    DArray<unsigned_long>::ensure
              (&DArray<std::pair<unsigned_int,_unsigned_int>_>::
                sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,s);
    uVar13 = 0;
    lVar9 = 0;
    while( true ) {
      do {
        local_38 = (param_type)((ulong)(uint)((int)s - (int)uVar13) << 0x20);
        rVar4 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_38,&Random::_eng,&local_38);
        uVar6 = (long)rVar4 + uVar13;
        lVar2 = *(long *)(this + 0x10);
        uVar3 = *(undefined8 *)(lVar2 + uVar6 * 8);
        uVar8 = (uint)uVar3;
        uVar10 = (undefined4)((ulong)uVar3 >> 0x20);
        uVar11 = s;
        uVar12 = uVar13;
        if (uVar13 < uVar6) {
          do {
            uVar1 = *(uint *)(lVar2 + uVar12 * 8);
            if (uVar8 < uVar1) {
              if (uVar6 == uVar11) {
                *(uint *)(lVar2 + uVar11 * 8) = uVar1;
                *(undefined4 *)(lVar2 + 4 + uVar11 * 8) = *(undefined4 *)(lVar2 + 4 + uVar12 * 8);
                uVar6 = uVar11 - 1;
                *(undefined8 *)(lVar2 + uVar12 * 8) = *(undefined8 *)(lVar2 + -8 + uVar11 * 8);
                *(uint *)(lVar2 + -8 + uVar11 * 8) = uVar8;
                *(undefined4 *)(lVar2 + -4 + uVar11 * 8) = uVar10;
                uVar11 = uVar6;
              }
              else {
                uVar3 = *(undefined8 *)(lVar2 + uVar12 * 8);
                *(undefined8 *)(lVar2 + uVar12 * 8) = *(undefined8 *)(lVar2 + uVar11 * 8);
                *(int *)(lVar2 + uVar11 * 8) = (int)uVar3;
                *(int *)(lVar2 + 4 + uVar11 * 8) = (int)((ulong)uVar3 >> 0x20);
                uVar11 = uVar11 - 1;
              }
            }
            else {
              uVar12 = uVar12 + 1;
            }
          } while (uVar12 < uVar6);
        }
        while (puVar7 = DArray<std::pair<unsigned_int,_unsigned_int>_>::
                        sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._array,
              uVar6 < uVar11) {
          uVar1 = *(uint *)(lVar2 + 8 + uVar6 * 8);
          if (uVar8 < uVar1) {
            uVar3 = *(undefined8 *)(lVar2 + uVar11 * 8);
            *(uint *)(lVar2 + uVar11 * 8) = uVar1;
            *(undefined4 *)(lVar2 + 4 + uVar11 * 8) = *(undefined4 *)(lVar2 + 0xc + uVar6 * 8);
            *(int *)(lVar2 + 8 + uVar6 * 8) = (int)uVar3;
            *(int *)(lVar2 + 0xc + uVar6 * 8) = (int)((ulong)uVar3 >> 0x20);
            uVar11 = uVar11 - 1;
          }
          else {
            *(uint *)(lVar2 + uVar6 * 8) = uVar1;
            *(undefined4 *)(lVar2 + 4 + uVar6 * 8) = *(undefined4 *)(lVar2 + 0xc + uVar6 * 8);
            *(uint *)(lVar2 + 8 + uVar6 * 8) = uVar8;
            *(undefined4 *)(lVar2 + 0xc + uVar6 * 8) = uVar10;
            uVar6 = uVar6 + 1;
          }
        }
        if (uVar6 + 1 < s) {
          DArray<std::pair<unsigned_int,_unsigned_int>_>::
          sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._array[lVar9] =
               uVar6 + 1;
          puVar7[lVar9 + 1] = s;
          lVar9 = lVar9 + 2;
        }
        s = uVar6 - 1;
      } while ((uVar6 != 0) && (uVar13 < s));
      if (lVar9 == 0) break;
      uVar13 = DArray<std::pair<unsigned_int,_unsigned_int>_>::
               sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._array[lVar9 + -2];
      s = DArray<std::pair<unsigned_int,_unsigned_int>_>::
          sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._array[lVar9 + -1];
      lVar9 = lVar9 + -2;
    }
  }
  return;
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }